

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O1

int main(void)

{
  ostream *poVar1;
  long *plVar2;
  undefined1 auVar3 [8];
  int *piStack_168;
  int e1 [5];
  int aiStack_148 [2];
  int searchRectMin [5];
  int aiStack_128 [2];
  int searchRectMax [5];
  int *piStack_108;
  int e2 [5];
  int *piStack_e8;
  int e3 [5];
  int *piStack_c8;
  int e4 [5];
  int *piStack_a8;
  int e5 [5];
  undefined1 local_78 [8];
  vector<int_*,_std::allocator<int_*>_> result;
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  tree;
  vector<int_*,_std::allocator<int_*>_> values;
  
  result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &piStack_168;
  piStack_168 = (int *)0x100000001;
  e1[0] = 1;
  e1[1] = 1;
  e1[2] = 1;
  piStack_108 = (int *)0x100000001;
  e2[0] = 1;
  e2[1] = 1;
  e2[2] = 1;
  piStack_e8 = (int *)0x200000001;
  e3[0] = 2;
  e3[1] = 2;
  e3[2] = 9;
  piStack_c8 = (int *)0x100000001;
  e4[0] = 1;
  e4[1] = 2;
  e4[2] = 1;
  piStack_a8 = (int *)0x800000008;
  e5[0] = 8;
  e5[1] = 8;
  e5[2] = 8;
  tree.boundingBoxMax = (int *)0x0;
  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
            ((vector<int*,std::allocator<int*>> *)&tree.boundingBoxMax,(iterator)0x0,
             (int **)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &piStack_108;
  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
            ((vector<int*,std::allocator<int*>> *)&tree.boundingBoxMax,(iterator)0x0,
             (int **)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &piStack_e8;
  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
            ((vector<int*,std::allocator<int*>> *)&tree.boundingBoxMax,(iterator)0x0,
             (int **)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &piStack_c8;
  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
            ((vector<int*,std::allocator<int*>> *)&tree.boundingBoxMax,(iterator)0x0,
             (int **)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &piStack_a8;
  std::vector<int*,std::allocator<int*>>::_M_realloc_insert<int*>
            ((vector<int*,std::allocator<int*>> *)&tree.boundingBoxMax,(iterator)0x0,
             (int **)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::vector<int_*,_std::allocator<int_*>_>::vector
            ((vector<int_*,_std::allocator<int_*>_> *)(e5 + 4),
             (vector<int_*,_std::allocator<int_*>_> *)&tree.boundingBoxMax);
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::KDTree((KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
            *)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,
           (vector<int_*,_std::allocator<int_*>_> *)(e5 + 4));
  if (stack0xffffffffffffff70 != (void *)0x0) {
    operator_delete(stack0xffffffffffffff70);
  }
  aiStack_148[0] = 0;
  aiStack_148[1] = 0;
  searchRectMin[0] = 0;
  searchRectMin[1] = 0;
  searchRectMin[2] = 0;
  aiStack_128[0] = 2;
  aiStack_128[1] = 2;
  searchRectMax[0] = 2;
  searchRectMax[1] = 2;
  searchRectMax[2] = 2;
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::queryRectangle((vector<int_*,_std::allocator<int_*>_> *)local_78,
                   (KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                    *)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,aiStack_148,aiStack_128);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found ",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," entries:",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  auVar3 = local_78;
  if (local_78 !=
      (undefined1  [8])
      result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,**(int **)auVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*(int **)auVar3)[1]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*(int **)auVar3)[2]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,(*(int **)auVar3)[3]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      plVar2 = (long *)std::ostream::operator<<(poVar1,(*(int **)auVar3)[4]);
      std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
      std::ostream::put((char)plVar2);
      std::ostream::flush();
      auVar3 = (undefined1  [8])((long)auVar3 + 8);
    } while (auVar3 != (undefined1  [8])
                       result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78);
  }
  kdtree::
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  ::~KDTree((KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
             *)&result.super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  if (tree.boundingBoxMax != (int *)0x0) {
    operator_delete(tree.boundingBoxMax);
  }
  return 1;
}

Assistant:

int main() {

	const int dim = 5;

	// prepare elements, five dimensional int arrays. we could also use e.g. doubles if we wanted.
	int e1[dim] = {1, 1, 1, 1, 1};
	int e2[dim] = {1, 1, 1, 1, 1};
	int e3[dim] = {1, 2, 2, 2, 9};
	int e4[dim] = {1, 1, 1, 2, 1};
	int e5[dim] = {8, 8, 8, 8, 8};

	// fill the elements into a vector
	std::vector<int*> values;
	values.push_back(e1);
	values.push_back(e2);
	values.push_back(e3);
	values.push_back(e4);
	values.push_back(e5);

	// build the tree. first template parameter is the type of the elements, second parameter is the number of dimensions
	kdtree::KDTree<int, dim> tree(values);

	// prepare search query. we search for elements whose values are between 0 and 2 on all dimensions
	int searchRectMin[5] = {0,0,0,0,0};
	int searchRectMax[5] = {2,2,2,2,2};

	// perform the search. result will contain the elements that match the query.
	std::vector<int*> result = tree.queryRectangle(searchRectMin, searchRectMax);

	// print results
	std::cout << "found " << result.size() << " entries:" << std::endl;
	for(std::vector<int*>::const_iterator it = result.begin(); it != result.end(); ++it) {
		std::cout << (*it)[0] << " " << (*it)[1] << " " << (*it)[2] << " " << (*it)[3]<< " " << (*it)[4] << std::endl;
	}

	return 1;
}